

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

float make_qp_quants(int n,int nmax,float *x,uint8_t *L,float *quant_weights)

{
  int i;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int i_3;
  int i_5;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar2;
  }
  fVar7 = 0.0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    if (fVar7 <= x[uVar2]) {
      fVar7 = x[uVar2];
    }
  }
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      L[uVar2] = '\0';
    }
    return 0.0;
  }
  fVar6 = (float)nmax / fVar7;
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    L[uVar2] = SUB41(x[uVar2] * fVar6 + 12582912.0,0);
  }
  fVar8 = 0.0;
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    fVar9 = (float)L[uVar2] * (-1.0 / fVar6) + x[uVar2];
    fVar8 = fVar8 + quant_weights[uVar2] * fVar9 * fVar9;
  }
  iVar1 = -4;
  do {
    fVar9 = fVar8;
    if (iVar1 != 0) {
      if (iVar1 == 5) break;
      fVar10 = ((float)iVar1 * 0.1 + (float)nmax) / fVar7;
      fVar11 = 0.0;
      for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        iVar5 = ((uint)(fVar10 * x[uVar2] + 12582912.0) & 0x7fffff) - 0x400000;
        if (nmax <= iVar5) {
          iVar5 = nmax;
        }
        fVar9 = (float)iVar5 * (-1.0 / fVar10) + x[uVar2];
        fVar11 = fVar11 + quant_weights[uVar2] * fVar9 * fVar9;
      }
      fVar9 = fVar11;
      if (fVar8 <= fVar11) {
        fVar9 = fVar8;
      }
      fVar6 = (float)(~-(uint)(fVar11 < fVar8) & (uint)fVar6 |
                     (uint)fVar10 & -(uint)(fVar11 < fVar8));
    }
    iVar1 = iVar1 + 1;
    fVar8 = fVar9;
  } while( true );
  fVar7 = 0.0;
  fVar8 = 0.0;
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    fVar9 = x[uVar2];
    iVar1 = ((uint)(fVar6 * fVar9 + 12582912.0) & 0x7fffff) - 0x400000;
    if (nmax <= iVar1) {
      iVar1 = nmax;
    }
    L[uVar2] = (uint8_t)iVar1;
    fVar10 = (float)iVar1;
    fVar7 = fVar7 + fVar10 * fVar10 * quant_weights[uVar2];
    fVar8 = fVar8 + fVar10 * fVar9 * quant_weights[uVar2];
  }
  iVar1 = 0;
  do {
    if (iVar1 == 5) break;
    iVar5 = 0;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      fVar6 = quant_weights[uVar2];
      fVar9 = x[uVar2];
      fVar11 = (float)L[uVar2];
      fVar10 = fVar7 - fVar11 * fVar11 * fVar6;
      fVar11 = fVar8 - fVar11 * fVar9 * fVar6;
      if ((0.0 < fVar11) && (0.0 < fVar10)) {
        uVar3 = ((uint)((fVar9 * fVar10) / fVar11 + 12582912.0) & 0x7fffff) - 0x400000;
        if (nmax <= (int)uVar3) {
          uVar3 = nmax;
        }
        if (uVar3 != L[uVar2]) {
          fVar10 = (float)(int)uVar3 * fVar6 * (float)(int)uVar3 + fVar10;
          fVar11 = (float)(int)uVar3 * fVar6 * fVar9 + fVar11;
          if (fVar8 * fVar8 * fVar10 < fVar11 * fVar11 * fVar7) {
            L[uVar2] = (uint8_t)uVar3;
            iVar5 = iVar5 + 1;
            fVar7 = fVar10;
            fVar8 = fVar11;
          }
        }
      }
    }
    iVar1 = iVar1 + 1;
  } while (iVar5 != 0);
  return fVar8 / fVar7;
}

Assistant:

static float make_qp_quants(int n, int nmax, const float * GGML_RESTRICT x, uint8_t * GGML_RESTRICT L, const float * quant_weights) {
    float max = 0;
    for (int i = 0; i < n; ++i) {
        max = MAX(max, x[i]);
    }
    if (!max) { // all zero
        for (int i = 0; i < n; ++i) { L[i] = 0; }
        return 0.f;
    }
    float iscale = nmax / max;
    for (int i = 0; i < n; ++i) {
        L[i] = nearest_int(iscale * x[i]);
    }
    float scale = 1/iscale;
    float best_mse = 0;
    for (int i = 0; i < n; ++i) {
        float diff = x[i] - scale*L[i];
        float w = quant_weights[i];
        best_mse += w*diff*diff;
    }
    for (int is = -4; is <= 4; ++is) {
        if (is == 0) continue;
        float iscale_is = (0.1f*is + nmax)/max;
        float scale_is = 1/iscale_is;
        float mse = 0;
        for (int i = 0; i < n; ++i) {
            int l = nearest_int(iscale_is*x[i]);
            l = MIN(nmax, l);
            float diff = x[i] - scale_is*l;
            float w = quant_weights[i];
            mse += w*diff*diff;
        }
        if (mse < best_mse) {
            best_mse = mse;
            iscale = iscale_is;
        }
    }
    float sumlx = 0;
    float suml2 = 0;
    for (int i = 0; i < n; ++i) {
        int l = nearest_int(iscale * x[i]);
        l = MIN(nmax, l);
        L[i] = l;
        float w = quant_weights[i];
        sumlx += w*x[i]*l;
        suml2 += w*l*l;
    }
    for (int itry = 0; itry < 5; ++itry) {
        int n_changed = 0;
        for (int i = 0; i < n; ++i) {
            float w = quant_weights[i];
            float slx = sumlx - w*x[i]*L[i];
            float sl2 = suml2 - w*L[i]*L[i];
            if (slx > 0 && sl2 > 0) {
                int new_l = nearest_int(x[i] * sl2 / slx);
                new_l = MIN(nmax, new_l);
                if (new_l != L[i]) {
                    slx += w*x[i]*new_l;
                    sl2 += w*new_l*new_l;
                    if (slx*slx*suml2 > sumlx*sumlx*sl2) {
                        L[i] = new_l; sumlx = slx; suml2 = sl2;
                        ++n_changed;
                    }
                }
            }
        }
        if (!n_changed) {
            break;
        }
    }
    return sumlx/suml2;
}